

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ParseInputFiles
          (CommandLineInterface *this,DescriptorPool *descriptor_pool,DiskSourceTree *source_tree,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar1;
  iterator __position;
  CommandLineInterface *pCVar2;
  bool bVar3;
  FileDescriptor *pFVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_file;
  pointer pbVar6;
  size_type in_R9;
  int index;
  bool bVar7;
  string_view s;
  string_view file_name;
  string_view name;
  FixedMapping replacements;
  FileDescriptor *parsed_file;
  FileDescriptor *local_b8;
  CommandLineInterface *local_b0;
  DescriptorPool *local_a8;
  iterator local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  lts_20250127 *local_80;
  pointer local_78;
  pointer local_70;
  vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
  *local_68;
  key_arg<std::basic_string_view<char>_> local_60;
  size_type local_50;
  pointer local_48;
  iterator local_40;
  
  local_b0 = this;
  local_68 = (vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)parsed_files;
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar1 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (this->input_files_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      file_name._M_str = (pbVar6->_M_dataplus)._M_p;
      file_name._M_len = pbVar6->_M_string_length;
      DescriptorPool::AddDirectInputFile(descriptor_pool,file_name,false);
    }
  }
  pbVar6 = (local_b0->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (local_b0->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = true;
  if (pbVar6 != local_70) {
    this_00 = &local_b0->direct_dependencies_;
    local_a8 = descriptor_pool;
    do {
      descriptor_pool = local_a8;
      pCVar2 = local_b0;
      name._M_str = (pbVar6->_M_dataplus)._M_p;
      name._M_len = pbVar6->_M_string_length;
      local_b8 = DescriptorPool::FindFileByName(local_a8,name);
      if (local_b8 == (FileDescriptor *)0x0) {
LAB_00d5000c:
        bVar7 = false;
        goto LAB_00d5000e;
      }
      __position._M_current = *(FileDescriptor ***)(local_68 + 8);
      if (__position._M_current == *(FileDescriptor ***)(local_68 + 0x10)) {
        std::
        vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FileDescriptor_const*const&>
                  (local_68,__position,&local_b8);
      }
      else {
        *__position._M_current = local_b8;
        *(long *)(local_68 + 8) = *(long *)(local_68 + 8) + 8;
      }
      if ((pCVar2->disallow_services_ == true) && (0 < local_b8->service_count_)) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(local_b8->name_->_M_dataplus)._M_p,
                            local_b8->name_->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,": This file contains services, but --disallow_services was used.",0x40);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        goto LAB_00d5000c;
      }
      if ((pCVar2->direct_dependencies_explicitly_set_ == true) && (0 < local_b8->dependency_count_)
         ) {
        bVar7 = false;
        index = 0;
        do {
          while( true ) {
            pFVar4 = FileDescriptor::dependency(local_b8,index);
            local_60._M_str = (pFVar4->name_->_M_dataplus)._M_p;
            local_60._M_len = pFVar4->name_->_M_string_length;
            local_a0 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                       ::find<std::basic_string_view<char,std::char_traits<char>>>
                                 ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                                   *)this_00,&local_60);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::AssertNotDebugCapacity
                      (&this_00->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      );
            local_40.ctrl_ = (ctrl_t *)0x0;
            bVar3 = absl::lts_20250127::container_internal::operator==(&local_a0,&local_40);
            if (!bVar3) break;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(local_b8->name_->_M_dataplus)._M_p,
                                local_b8->name_->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
            local_78 = (local_b0->direct_dependencies_violation_msg_)._M_dataplus._M_p;
            local_80 = (lts_20250127 *)
                       (local_b0->direct_dependencies_violation_msg_)._M_string_length;
            pFVar4 = FileDescriptor::dependency(local_b8,index);
            local_48 = (pFVar4->name_->_M_dataplus)._M_p;
            local_50 = pFVar4->name_->_M_string_length;
            local_60._M_len = 2;
            local_60._M_str = "%s";
            s._M_str = (char *)&local_60;
            s._M_len = (size_t)local_78;
            replacements._M_len = in_R9;
            replacements._M_array = (iterator)0x1;
            absl::lts_20250127::StrReplaceAll_abi_cxx11_
                      ((string *)&local_a0,local_80,s,replacements);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_a0.ctrl_,(long)local_a0.field_1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.ctrl_ != &local_90) {
              operator_delete(local_a0.ctrl_,local_90._M_allocated_capacity + 1);
            }
            index = index + 1;
            bVar7 = true;
            if (local_b8->dependency_count_ <= index) goto LAB_00d4ffae;
          }
          index = index + 1;
        } while (index < local_b8->dependency_count_);
        if (bVar7) {
LAB_00d4ffae:
          bVar7 = false;
          descriptor_pool = local_a8;
          goto LAB_00d5000e;
        }
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != local_70);
    bVar7 = true;
    descriptor_pool = local_a8;
  }
LAB_00d5000e:
  DescriptorPool::ClearDirectInputFiles(descriptor_pool);
  return bVar7;
}

Assistant:

bool CommandLineInterface::ParseInputFiles(
    DescriptorPool* descriptor_pool, DiskSourceTree* source_tree,
    std::vector<const FileDescriptor*>* parsed_files) {

  if (!proto_path_.empty()) {
    // Track unused imports in all source files that were loaded from the
    // filesystem. We do not track unused imports for files loaded from
    // descriptor sets as they may be programmatically generated in which case
    // exerting this level of rigor is less desirable. We're also making the
    // assumption that the initial parse of the proto from the filesystem
    // was rigorous in checking unused imports and that the descriptor set
    // being parsed was produced then and that it was subsequent mutations
    // of that descriptor set that left unused imports.
    //
    // Note that relying on proto_path exclusively is limited in that we may
    // be loading descriptors from both the filesystem and descriptor sets
    // depending on the invocation. At least for invocations that are
    // exclusively reading from descriptor sets, we can eliminate this failure
    // condition.
    for (const auto& input_file : input_files_) {
      descriptor_pool->AddDirectInputFile(input_file);
    }
  }

  bool result = true;
  // Parse each file.
  for (const auto& input_file : input_files_) {
    // Import the file.
    const FileDescriptor* parsed_file =
        descriptor_pool->FindFileByName(input_file);
    if (parsed_file == nullptr) {
      result = false;
      break;
    }
    parsed_files->push_back(parsed_file);

    // Enforce --disallow_services.
    if (disallow_services_ && parsed_file->service_count() > 0) {
      std::cerr << parsed_file->name()
                << ": This file contains services, but "
                   "--disallow_services was used."
                << std::endl;
      result = false;
      break;
    }

    // Enforce --direct_dependencies
    if (direct_dependencies_explicitly_set_) {
      bool indirect_imports = false;
      for (int i = 0; i < parsed_file->dependency_count(); ++i) {
        if (direct_dependencies_.find(parsed_file->dependency(i)->name()) ==
            direct_dependencies_.end()) {
          indirect_imports = true;
          std::cerr << parsed_file->name() << ": "
                    << absl::StrReplaceAll(
                           direct_dependencies_violation_msg_,
                           {{"%s", parsed_file->dependency(i)->name()}})
                    << std::endl;
        }
      }
      if (indirect_imports) {
        result = false;
        break;
      }
    }
  }
  descriptor_pool->ClearDirectInputFiles();
  return result;
}